

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O1

ON_MeshNgon * __thiscall
ON_MeshNgonAllocator::AllocateNgon(ON_MeshNgonAllocator *this,uint Vcount,uint Fcount)

{
  void *pvVar1;
  size_t sVar2;
  ON_MeshNgon *pOVar3;
  long *plVar4;
  uint *puVar5;
  uint uVar6;
  ON_FixedSizePool *this_00;
  
  if (Vcount < 3) {
    return (ON_MeshNgon *)0x0;
  }
  uVar6 = Fcount + Vcount;
  if (uVar6 < 8) {
    sVar2 = ON_FixedSizePool::SizeofElement(&this->m_7);
    if (sVar2 != 0x38) {
      ON_FixedSizePool::Create(&this->m_7,0x38,0,0);
    }
    pOVar3 = (ON_MeshNgon *)ON_FixedSizePool::AllocateElement(&this->m_7);
    uVar6 = 7;
    goto LAB_0052c776;
  }
  if (uVar6 < 0x10) {
    this_00 = &this->m_15;
    sVar2 = ON_FixedSizePool::SizeofElement(this_00);
    if (sVar2 != 0x58) {
      ON_FixedSizePool::Create(this_00,0x58,0,0);
    }
    pOVar3 = (ON_MeshNgon *)ON_FixedSizePool::AllocateElement(this_00);
    uVar6 = 0xf;
    goto LAB_0052c776;
  }
  if (uVar6 < 0x20) {
    plVar4 = (long *)this->m_31;
    if (plVar4 == (long *)0x0) {
      uVar6 = 0x1f;
      goto LAB_0052c736;
    }
    this->m_31 = (void *)*plVar4;
    uVar6 = 0x1f;
  }
  else {
    if (uVar6 < 0x40) {
      plVar4 = (long *)this->m_63;
      if (plVar4 != (long *)0x0) {
        this->m_63 = (void *)*plVar4;
        uVar6 = 0x3f;
        goto LAB_0052c74b;
      }
      uVar6 = 0x3f;
    }
    else {
      uVar6 = uVar6 | 7;
    }
LAB_0052c736:
    plVar4 = (long *)onmalloc((ulong)(uVar6 + 1) * 4 + 0x28);
  }
LAB_0052c74b:
  if (plVar4 == (long *)0x0) {
    return (ON_MeshNgon *)0x0;
  }
  pvVar1 = this->m_active;
  *plVar4 = (long)pvVar1;
  if (pvVar1 != (void *)0x0) {
    *(long **)((long)pvVar1 + 8) = plVar4;
  }
  pOVar3 = (ON_MeshNgon *)(plVar4 + 2);
  plVar4[1] = 0;
  this->m_active = plVar4;
LAB_0052c776:
  if (pOVar3 != (ON_MeshNgon *)0x0) {
    pOVar3[1].m_Vcount = uVar6;
    puVar5 = (uint *)0x0;
    if (Fcount != 0) {
      puVar5 = &pOVar3[1].m_Fcount + Vcount;
    }
    pOVar3->m_vi = &pOVar3[1].m_Fcount;
    pOVar3->m_fi = puVar5;
    pOVar3->m_Vcount = Vcount;
    pOVar3->m_Fcount = Fcount;
  }
  return pOVar3;
}

Assistant:

ON_MeshNgon* ON_MeshNgonAllocator::AllocateNgon(
  unsigned int Vcount,
  unsigned int Fcount
  )
{
  struct ON_MeshNgonLink* link;
  ON_MeshNgon* ngon;
  unsigned int* a;
  unsigned int capacity;

  if ( Vcount < 3  )
    return 0;

  capacity = Vcount+Fcount;
  if ( capacity <= 7 )
  {
    capacity = 7;
    if ( SizeofNgon(capacity) != m_7.SizeofElement() )
      m_7.Create(SizeofNgon(capacity),0,0);
    ngon = (ON_MeshNgon*)m_7.AllocateElement();
  }
  else if ( capacity <= 15 )
  {
    capacity = 15;
    if ( SizeofNgon(capacity) != m_15.SizeofElement() )
      m_15.Create(SizeofNgon(capacity),0,0);
    ngon = (ON_MeshNgon*)m_15.AllocateElement();
  }
  else 
  {
    for(;;)
    {
      link = 0;
      if ( capacity <= 31 )
      {
        capacity = 31;
        if ( 0 != m_31 )
        {
          link = (struct ON_MeshNgonLink*)m_31;
          m_31 = link->next;
          break;
        }
      }
      else if ( capacity <= 63 )
      {
        capacity = 63;
        if ( 0 != m_63 )
        {
          link = (struct ON_MeshNgonLink*)m_63;
          m_63 = link->next;
          break;
        }
      }
      else
      {
        // make capacity % 8 = 7
        unsigned int n = (capacity % 8);
        capacity += (7-n);
      }
      link = (struct ON_MeshNgonLink*)onmalloc(sizeof(*link) + SizeofNgon(capacity));
      break;
    }
    if ( 0 == link )
      return 0;
    ngon = (ON_MeshNgon*)(link+1);
    link->next = (struct ON_MeshNgonLink*)m_active;
    if ( link->next )
      link->next->prev = link;
    link->prev = 0;
    m_active = link;
  }

  if ( 0 != ngon )
  {
    a = (unsigned int*)(ngon+1);
    *a++ = capacity;
    ngon->m_vi = a;
    ngon->m_fi = (Fcount > 0) ? (ngon->m_vi + Vcount) : 0;
    ngon->m_Vcount = Vcount;
    ngon->m_Fcount = Fcount;
    //memset(a,0xFF,capacity*sizeof(a[0])); // almost always a waste of time - user must init
  }

  return ngon;
}